

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

void __thiscall
crnlib::symbol_codec::decode_set_input_buffer
          (symbol_codec *this,uint8 *pBuf,size_t buf_size,uint8 *pBuf_next,bool eof_flag)

{
  this->m_pDecode_buf = pBuf;
  this->m_pDecode_buf_next = pBuf_next;
  this->m_decode_buf_size = buf_size;
  this->m_pDecode_buf_end = pBuf + buf_size;
  this->m_decode_buf_eof = this->m_pDecode_need_bytes_func == (need_bytes_func_ptr)0x0 || eof_flag;
  return;
}

Assistant:

void symbol_codec::decode_set_input_buffer(const uint8* pBuf, size_t buf_size, const uint8* pBuf_next, bool eof_flag)
    {
        CRNLIB_ASSERT(m_mode == cDecoding);

        m_pDecode_buf = pBuf;
        m_pDecode_buf_next = pBuf_next;
        m_decode_buf_size = buf_size;
        m_pDecode_buf_end = pBuf + buf_size;

        if (!m_pDecode_need_bytes_func)
        {
            m_decode_buf_eof = true;
        }
        else
        {
            m_decode_buf_eof = eof_flag;
        }
    }